

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O2

void __thiscall cmCursesBoolWidget::SetValueAsBool(cmCursesBoolWidget *this,bool value)

{
  undefined7 in_register_00000031;
  allocator local_29;
  string local_28 [32];
  
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    std::__cxx11::string::string(local_28,"OFF",&local_29);
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_28);
  }
  else {
    std::__cxx11::string::string(local_28,"ON",&local_29);
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_28);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void cmCursesBoolWidget::SetValueAsBool(bool value)
{
  if (value)
    {
    this->SetValue("ON");
    }
  else
    {
    this->SetValue("OFF");
    }
}